

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall List::on_key_down(List *this,ALLEGRO_KEYBOARD_EVENT *event)

{
  int iVar1;
  
  iVar1 = (*(this->super_Widget)._vptr_Widget[0x10])();
  if ((char)iVar1 == '\0') {
    if (event->keycode == 0x54) {
      if (this->selected_item == 0) {
        return;
      }
      this->selected_item = this->selected_item - 1;
    }
    else {
      if (event->keycode != 0x55) {
        return;
      }
      if (((long)(this->items).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->items).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= (ulong)this->selected_item)
      {
        return;
      }
      this->selected_item = this->selected_item + 1;
    }
    ((this->super_Widget).dialog)->draw_requested = true;
  }
  return;
}

Assistant:

void List::on_key_down(const ALLEGRO_KEYBOARD_EVENT & event)
{
   if (is_disabled())
      return;

   switch (event.keycode) {
      case ALLEGRO_KEY_DOWN:
         if (selected_item < items.size() - 1) {
            selected_item++;
            dialog->request_draw();
         }
         break;

      case ALLEGRO_KEY_UP:
         if (selected_item > 0) {
            selected_item--;
            dialog->request_draw();
         }
         break;
   }
}